

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::XThreadPaf::FulfillScope::~FulfillScope(FulfillScope *this)

{
  Executor *pEVar1;
  Impl *pIVar2;
  State *pSVar3;
  EventLoop *maybe;
  EventPort *pEVar4;
  EventPort *p;
  EventPort *_p1238;
  EventLoop *l;
  EventLoop *_l1237;
  undefined1 local_20 [8];
  Locked<kj::Executor::Impl::State> lock;
  FulfillScope *this_local;
  
  if (this->obj != (XThreadPaf *)0x0) {
    lock.ptr = (State *)this;
    pEVar1 = Own<const_kj::Executor,_std::nullptr_t>::operator->(&this->obj->executor);
    pIVar2 = Own<kj::Executor::Impl,_std::nullptr_t>::operator->(&pEVar1->impl);
    MutexGuarded<kj::Executor::Impl::State>::lockExclusive
              ((MutexGuarded<kj::Executor::Impl::State> *)local_20,pIVar2);
    pSVar3 = Locked<kj::Executor::Impl::State>::operator->
                       ((Locked<kj::Executor::Impl::State> *)local_20);
    List<kj::_::XThreadPaf,_&kj::_::XThreadPaf::link>::add(&pSVar3->fulfilled,this->obj);
    this->obj->state = FULFILLED;
    pSVar3 = Locked<kj::Executor::Impl::State>::operator->
                       ((Locked<kj::Executor::Impl::State> *)local_20);
    maybe = readMaybe<kj::EventLoop>(&pSVar3->loop);
    if ((maybe != (EventLoop *)0x0) &&
       (pEVar4 = readMaybe<kj::EventPort>(&maybe->port), pEVar4 != (EventPort *)0x0)) {
      (*pEVar4->_vptr_EventPort[3])();
    }
    Locked<kj::Executor::Impl::State>::~Locked((Locked<kj::Executor::Impl::State> *)local_20);
  }
  return;
}

Assistant:

XThreadPaf::FulfillScope::~FulfillScope() noexcept(false) {
  if (obj != nullptr) {
    auto lock = obj->executor->impl->state.lockExclusive();
    lock->fulfilled.add(*obj);
    __atomic_store_n(&obj->state, FULFILLED, __ATOMIC_RELEASE);
    KJ_IF_SOME(l, lock->loop) {
      KJ_IF_SOME(p, l.port) {
        // TODO(perf): It's annoying we have to call wake() with the lock held, but we have to
        //   prevent the destination EventLoop from being destroyed first.
        p.wake();
      }
    } else {
      // The thread which called kj::newPromiseAndCrossThreadFulfiller<T>() apparently exited its
      // own event loop without canceling the cross-thread promise first. Whoever now owns the
      // promise can only do one thing with it safely: destroy it.
    }
  }
}